

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels_resize
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                int target_width,int target_height,Allocator *allocator)

{
  int *piVar1;
  Mat dst;
  
  if (h == target_height && w == target_width) {
    from_pixels(__return_storage_ptr__,pixels,type,w,h,stride,allocator);
    return __return_storage_ptr__;
  }
  if ((type & 0xffffU) - 1 < 2) {
    dst.cstep = 0;
    dst.data = (void *)0x0;
    dst.refcount._0_4_ = 0;
    dst.refcount._4_4_ = 0;
    dst.elemsize._0_4_ = 0;
    dst._20_8_ = 0;
    dst.allocator = (Allocator *)0x0;
    dst.dims = 0;
    dst.w = 0;
    dst.h = 0;
    dst.d = 0;
    dst.c = 0;
    create(&dst,target_width,target_height,3,3,(Allocator *)0x0);
    resize_bilinear_c3(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                       target_width * 3);
    from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator);
    piVar1 = (int *)CONCAT44(dst.refcount._4_4_,dst.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (dst.allocator != (Allocator *)0x0) {
      (*(dst.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  else if ((type & 0xffffU) == 3) {
    dst.cstep = 0;
    dst.data = (void *)0x0;
    dst.refcount._0_4_ = 0;
    dst.refcount._4_4_ = 0;
    dst.elemsize._0_4_ = 0;
    dst._20_8_ = 0;
    dst.allocator = (Allocator *)0x0;
    dst.dims = 0;
    dst.w = 0;
    dst.h = 0;
    dst.d = 0;
    dst.c = 0;
    create(&dst,target_width,target_height,1,1,(Allocator *)0x0);
    resize_bilinear_c1(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,target_width);
    from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator);
    piVar1 = (int *)CONCAT44(dst.refcount._4_4_,dst.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (dst.allocator != (Allocator *)0x0) {
      (*(dst.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  else {
    if ((type & 0xfffeU) != 4) {
      from_pixels_resize();
      return __return_storage_ptr__;
    }
    dst.cstep = 0;
    dst.data = (void *)0x0;
    dst.refcount._0_4_ = 0;
    dst.refcount._4_4_ = 0;
    dst.elemsize._0_4_ = 0;
    dst._20_8_ = 0;
    dst.allocator = (Allocator *)0x0;
    dst.dims = 0;
    dst.w = 0;
    dst.h = 0;
    dst.d = 0;
    dst.c = 0;
    create(&dst,target_width,target_height,4,4,(Allocator *)0x0);
    resize_bilinear_c4(pixels,w,h,stride,(uchar *)dst.data,target_width,target_height,
                       target_width * 4);
    from_pixels(__return_storage_ptr__,(uchar *)dst.data,type,target_width,target_height,allocator);
    piVar1 = (int *)CONCAT44(dst.refcount._4_4_,dst.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return __return_storage_ptr__;
    }
    if (dst.allocator != (Allocator *)0x0) {
      (*(dst.allocator)->_vptr_Allocator[3])();
      return __return_storage_ptr__;
    }
  }
  if (dst.data != (void *)0x0) {
    dst.allocator = (Allocator *)0x0;
    free(dst.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}